

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O1

bool __thiscall zmq::xsub_t::xhas_in(xsub_t *this)

{
  msg_t *msg_;
  bool bVar1;
  byte bVar2;
  ssize_t sVar3;
  uint *puVar4;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  bool bVar5;
  int in_R8D;
  
  bVar5 = true;
  if ((this->_more_recv == false) && (this->_has_message == false)) {
    msg_ = &this->_message;
    bVar5 = true;
    do {
      sVar3 = fq_t::recv(&this->_fq,(int)msg_,in_RDX,in_RCX,in_R8D);
      if ((int)sVar3 == 0) {
        in_RDX = extraout_RDX;
        if (((this->super_socket_base_t).super_own_t.options.filter != true) ||
           (bVar1 = match(this,msg_), in_RDX = extraout_RDX_01, bVar1)) {
          this->_has_message = true;
          bVar5 = true;
          bVar1 = false;
        }
        else {
          bVar2 = msg_t::flags(msg_);
          bVar1 = true;
          in_RDX = extraout_RDX_02;
          while ((bVar2 & 1) != 0) {
            sVar3 = fq_t::recv(&this->_fq,(int)msg_,in_RDX,in_RCX,in_R8D);
            if ((int)sVar3 != 0) {
              xhas_in();
            }
            bVar2 = msg_t::flags(msg_);
            in_RDX = extraout_RDX_03;
          }
        }
      }
      else {
        puVar4 = (uint *)__errno_location();
        in_RDX = extraout_RDX_00;
        if (*puVar4 != 0xb) {
          xhas_in((xsub_t *)(ulong)*puVar4);
          in_RDX = extraout_RDX_04;
        }
        bVar1 = false;
        bVar5 = false;
      }
    } while (bVar1);
  }
  return bVar5;
}

Assistant:

bool zmq::xsub_t::xhas_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more_recv)
        return true;

    //  If there's already a message prepared by a previous call to zmq_poll,
    //  return straight ahead.
    if (_has_message)
        return true;

    //  TODO: This can result in infinite loop in the case of continuous
    //  stream of non-matching messages.
    while (true) {
        //  Get a message using fair queueing algorithm.
        int rc = _fq.recv (&_message);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0) {
            errno_assert (errno == EAGAIN);
            return false;
        }

        //  Check whether the message matches at least one subscription.
        if (!options.filter || match (&_message)) {
            _has_message = true;
            return true;
        }

        //  Message doesn't match. Pop any remaining parts of the message
        //  from the pipe.
        while (_message.flags () & msg_t::more) {
            rc = _fq.recv (&_message);
            errno_assert (rc == 0);
        }
    }
}